

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

void __thiscall
Diligent::RefCntWeakPtr<Diligent::IAsyncTask>::RefCntWeakPtr
          (RefCntWeakPtr<Diligent::IAsyncTask> *this,RefCntAutoPtr<Diligent::IAsyncTask> *AutoPtr)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  IAsyncTask *pIVar3;
  RefCountersImpl *local_38;
  RefCntAutoPtr<Diligent::IAsyncTask> *AutoPtr_local;
  RefCntWeakPtr<Diligent::IAsyncTask> *this_local;
  
  bVar1 = Diligent::RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)AutoPtr);
  if (bVar1) {
    pIVar3 = RefCntAutoPtr<Diligent::IAsyncTask>::operator->(AutoPtr);
    iVar2 = (*(pIVar3->super_IObject)._vptr_IObject[3])();
    local_38 = ClassPtrCast<Diligent::RefCountersImpl,Diligent::IReferenceCounters>
                         ((IReferenceCounters *)CONCAT44(extraout_var,iVar2));
  }
  else {
    local_38 = (RefCountersImpl *)0x0;
  }
  this->m_pRefCounters = local_38;
  pIVar3 = Diligent::RefCntAutoPtr::operator_cast_to_IAsyncTask_((RefCntAutoPtr *)AutoPtr);
  this->m_pObject = pIVar3;
  if (this->m_pRefCounters != (RefCountersImpl *)0x0) {
    RefCountersImpl::AddWeakRef(this->m_pRefCounters);
  }
  return;
}

Assistant:

explicit RefCntWeakPtr(RefCntAutoPtr<T>& AutoPtr) noexcept :
        m_pRefCounters{AutoPtr ? ClassPtrCast<RefCountersImpl>(AutoPtr->GetReferenceCounters()) : nullptr},
        m_pObject{static_cast<T*>(AutoPtr)}
    {
        if (m_pRefCounters)
            m_pRefCounters->AddWeakRef();
    }